

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O0

void __thiscall
TestPluginManagerPathResolution_RespectsAbsolutePath_Plugin_Test::TestBody
          (TestPluginManagerPathResolution_RespectsAbsolutePath_Plugin_Test *this)

{
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher;
  AssertHelper local_110;
  Message local_108;
  string local_100;
  path local_e0;
  string local_b8 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator<char> local_31;
  string local_30 [8];
  string pluginFile;
  TestPluginManagerPathResolution_RespectsAbsolutePath_Plugin_Test *this_local;
  
  pluginFile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"/path/to/some.plugin.so",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string(local_b8,local_30);
  testing::Eq<std::__cxx11::string>(&local_98,(testing *)local_b8,x);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::string>>
            (&local_78,(internal *)&local_98,matcher);
  std::__cxx11::string::string((string *)&local_100,local_30);
  plugin::PluginManager::ResolvePluginPath(&local_e0,&local_100);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::string>>::operator()
            (local_58,(char *)&local_78,
             (path *)"plugin::PluginManager::ResolvePluginPath(pluginFile)");
  std::filesystem::__cxx11::path::~path(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_78);
  testing::internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher(&local_98);
  std::__cxx11::string::~string(local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, RespectsAbsolutePath_Plugin)
{
    std::string pluginFile("/path/to/some.plugin.so");

    EXPECT_THAT(plugin::PluginManager::ResolvePluginPath(pluginFile), Eq(pluginFile));
}